

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS ref_facelift_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *complexity)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  int cell;
  long lVar3;
  double dVar4;
  REF_DBL det;
  REF_DBL area;
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL m2 [3];
  REF_DBL n [3];
  REF_INT nodes [27];
  double local_138;
  double local_130;
  REF_DBL local_128 [4];
  REF_DBL local_108 [4];
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *complexity = 0.0;
  if (0 < ref_cell->max) {
    cell = 0;
    do {
      RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar1 == 0) {
        uVar2 = ref_node_tri_area(ref_node,local_a8,&local_130);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x536,"ref_facelift_complexity",(ulong)uVar2,"area");
          return uVar2;
        }
        if (0 < ref_cell->node_per) {
          lVar3 = 0;
          do {
            if (ref_node->ref_mpi->id == ref_node->part[local_a8[lVar3]]) {
              uVar2 = ref_recon_rsn(ref_grid,local_a8[lVar3],local_108,local_128,local_c8);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x539,"ref_facelift_complexity",(ulong)uVar2,"rsn");
                return uVar2;
              }
              uVar2 = ref_matrix_extract2(metric + (long)local_a8[lVar3] * 6,local_108,local_128,
                                          local_e8);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x53b,"ref_facelift_complexity",(ulong)uVar2,"extract");
                return uVar2;
              }
              uVar2 = ref_matrix_det_m2(local_e8,&local_138);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x53c,"ref_facelift_complexity",(ulong)uVar2,"2x2 det");
                return uVar2;
              }
              if (0.0 < local_138) {
                if (local_138 < 0.0) {
                  dVar4 = sqrt(local_138);
                }
                else {
                  dVar4 = SQRT(local_138);
                }
                *complexity = (dVar4 * local_130) / (double)ref_cell->node_per + *complexity;
              }
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < ref_cell->node_per);
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  uVar2 = ref_mpi_allsum(ref_grid->mpi,complexity,1,3);
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x545,"ref_facelift_complexity",(ulong)uVar2,"dbl sum");
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_complexity(REF_DBL *metric,
                                                  REF_GRID ref_grid,
                                                  REF_DBL *complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL area, det, m2[3], r[3], s[3], n[3];
  ref_cell = ref_grid_tri(ref_grid);
  *complexity = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_recon_rsn(ref_grid, nodes[cell_node], r, s, n), "rsn");
        RSS(ref_matrix_extract2(&(metric[6 * nodes[cell_node]]), r, s, m2),
            "extract");
        RSS(ref_matrix_det_m2(m2, &det), "2x2 det");
        if (det > 0.0) {
          (*complexity) +=
              sqrt(det) * area / ((REF_DBL)ref_cell_node_per(ref_cell));
        }
      }
    }
  }
  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), complexity, 1, REF_DBL_TYPE),
      "dbl sum");

  return REF_SUCCESS;
}